

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

void __thiscall
duckdb::ZSTDCompressionState::CreateEmptySegment(ZSTDCompressionState *this,idx_t row_start)

{
  BlockManager *pBVar1;
  CompressionFunction *function;
  undefined8 uVar2;
  DatabaseInstance *pDVar3;
  LogicalType *type;
  idx_t iVar4;
  idx_t iVar5;
  BufferManager *pBVar6;
  pointer pCVar7;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  undefined1 local_58 [40];
  
  local_58._8_8_ = row_start;
  pDVar3 = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  pBVar1 = (this->super_CompressionState).info.block_manager;
  function = this->function;
  iVar4 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar1->block_header_size);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)local_58,pDVar3,function,type,local_58._8_8_,iVar4 - iVar5,
             (this->super_CompressionState).info.block_manager);
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (ColumnSegment *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->segment,(pointer)uVar2);
  pDVar3 = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  pBVar6 = BufferManager::GetBufferManager(pDVar3);
  pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->segment);
  (*pBVar6->_vptr_BufferManager[7])(local_58 + 0x10,pBVar6,&pCVar7->block);
  BufferHandle::operator=(&this->segment_handle,(BufferHandle *)(local_58 + 0x10));
  BufferHandle::~BufferHandle((BufferHandle *)(local_58 + 0x10));
  uVar2 = local_58._0_8_;
  if ((ColumnSegment *)local_58._0_8_ != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment((ColumnSegment *)local_58._0_8_);
    operator_delete((void *)uVar2);
  }
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();
		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		segment = std::move(compressed_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(checkpoint_data.GetDatabase());
		segment_handle = buffer_manager.Pin(segment->block);
	}